

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

type __thiscall
duckdb::Serializer::WriteValue<duckdb::AlterForeignKeyType>
          (Serializer *this,AlterForeignKeyType value)

{
  char *pcVar1;
  undefined8 in_RDX;
  undefined1 in_SIL;
  long *in_RDI;
  char *str;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    (**(code **)(*in_RDI + 0x78))(in_RDI,in_SIL,in_RDX,in_SIL);
  }
  else {
    pcVar1 = EnumUtil::ToChars<duckdb::AlterForeignKeyType>(AFT_ADD);
    (**(code **)(*in_RDI + 0xe8))(in_RDI,pcVar1);
  }
  return;
}

Assistant:

typename std::enable_if<std::is_enum<T>::value, void>::type WriteValue(const T value) {
		if (options.serialize_enum_as_string) {
			// Use the enum serializer to lookup tostring function
			auto str = EnumUtil::ToChars(value);
			WriteValue(str);
		} else {
			// Use the underlying type
			WriteValue(static_cast<typename std::underlying_type<T>::type>(value));
		}
	}